

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubDVertexEdgeProperties::HasInteriorVertexTopology(ON_SubDVertexEdgeProperties *this)

{
  if ((((this->m_null_edge_count == 0) && (this->m_edge_count == this->m_face_count)) &&
      (this->m_boundary_edge_count == 0)) && (1 < this->m_interior_edge_count)) {
    return this->m_nonmanifold_edge_count == 0;
  }
  return false;
}

Assistant:

bool ON_SubDVertexEdgeProperties::HasInteriorVertexTopology() const
{
  return 
    m_null_edge_count == 0
    && m_edge_count == m_face_count
    && m_boundary_edge_count == 0
    && m_interior_edge_count >= 2
    && m_nonmanifold_edge_count == 0
    ;
}